

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O1

int __thiscall dit::anon_unknown_0::ListParserTests::init(ListParserTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"single_case",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x23f126;
  pTVar1[1].m_testCtx = (TestContext *)init::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 2;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "simple_group_1","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "simple_group_2","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\na.c";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"separator_ln",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\na.c";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"separator_cr",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\ra.c";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "separator_crlf","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\r\na.c";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"end_ln","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\na.c\n";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"end_cr","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\na.c\r";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"end_crlf","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\na.c\r\n";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"two_groups",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b\nc.d\nc.e";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 10;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"case_group",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a\nc.d\nc.e";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 10;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"group_case",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"c.d\nc.e\na";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 10;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"long_name","")
  ;
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b.c.d.e.f.g.h.i.j.k.l.m.n.o.p.q.r.s.t.u.v.x";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "partial_prefix","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.b.c.d.e\na.b.c.f\nx.y.z\na.b.c.d.g\na.b.c.x\n";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 8;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"reparenting",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00273370;
  pTVar1[1]._vptr_TestNode = (_func_int **)"a.a.c.d\na.b.c.d\n";
  pTVar1[1].m_testCtx = (TestContext *)(anonymous_namespace)::ListParserTests::init()::subCases;
  *(undefined4 *)&pTVar1[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_string",
             "");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x2389cd;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"empty_line",""
            );
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)0x2389cc;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "empty_group_name","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)".test";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "empty_case_name","");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002733d8;
  pTVar1[1]._vptr_TestNode = (_func_int **)"test.";
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		{
			static const char* const	caseList	= "test";
			static const MatchCase		subCases[]	=
			{
				{ "test",		MatchCase::MATCH_CASE	},
				{ "test.cd",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "single_case", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
			};
			addChild(new CaseListParserCase(m_testCtx, "simple_group_1", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\na.c";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "simple_group_2", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\na.c";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "separator_ln", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\ra.c";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "separator_cr", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\r\na.c";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "separator_crlf", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\na.c\n";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "end_ln", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\na.c\r";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "end_cr", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\na.c\r\n";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.a",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "end_crlf", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b\nc.d\nc.e";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_GROUP	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::MATCH_CASE	},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "two_groups", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a\nc.d\nc.e";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_CASE	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "case_group", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "c.d\nc.e\na";
			static const MatchCase		subCases[]	=
			{
				{ "a",		MatchCase::MATCH_CASE	},
				{ "b",		MatchCase::NO_MATCH		},
				{ "a.b",	MatchCase::NO_MATCH		},
				{ "a.c",	MatchCase::NO_MATCH		},
				{ "a.d",	MatchCase::NO_MATCH		},
				{ "a.e",	MatchCase::NO_MATCH		},
				{ "c",		MatchCase::MATCH_GROUP	},
				{ "c.b",	MatchCase::NO_MATCH		},
				{ "c.d",	MatchCase::MATCH_CASE	},
				{ "c.e",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "group_case", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	= "a.b.c.d.e.f.g.h.i.j.k.l.m.n.o.p.q.r.s.t.u.v.x";
			static const MatchCase		subCases[]	=
			{
				{ "a",												MatchCase::MATCH_GROUP	},
				{ "b",												MatchCase::NO_MATCH		},
				{ "a.b",											MatchCase::MATCH_GROUP	},
				{ "a.b.c.d.e.f.g.h.i.j.k.l.m.n.o.p.q.r.s.t.u.v.x",	MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "long_name", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	=
				"a.b.c.d.e\n"
				"a.b.c.f\n"
				"x.y.z\n"
				"a.b.c.d.g\n"
				"a.b.c.x\n";
			static const MatchCase		subCases[]	=
			{
				{ "a",				MatchCase::MATCH_GROUP	},
				{ "a.b",			MatchCase::MATCH_GROUP	},
				{ "a.b.c.d.e",		MatchCase::MATCH_CASE	},
				{ "a.b.c.d.g",		MatchCase::MATCH_CASE	},
				{ "x.y",			MatchCase::MATCH_GROUP	},
				{ "x.y.z",			MatchCase::MATCH_CASE	},
				{ "a.b.c.f",		MatchCase::MATCH_CASE	},
				{ "a.b.c.x",		MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "partial_prefix", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}
		{
			static const char* const	caseList	=
				"a.a.c.d\n"
				"a.b.c.d\n";
			static const MatchCase		subCases[]	=
			{
				{ "a",				MatchCase::MATCH_GROUP	},
				{ "a.a",			MatchCase::MATCH_GROUP	},
				{ "a.b.c.d",		MatchCase::MATCH_CASE	},
				{ "a.b.c.d",		MatchCase::MATCH_CASE	},
			};
			addChild(new CaseListParserCase(m_testCtx, "reparenting", caseList, subCases, DE_LENGTH_OF_ARRAY(subCases)));
		}

		// Negative tests
		addChild(new NegativeCaseListCase(m_testCtx, "empty_string",			""));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_line",				"\n"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_group_name",		".test"));
		addChild(new NegativeCaseListCase(m_testCtx, "empty_case_name",			"test."));
	}